

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O1

void __thiscall NukedOPL3::Reset(NukedOPL3 *this)

{
  opl_chip *__s;
  Bit16s *pBVar1;
  opl_slot *poVar2;
  byte bVar3;
  opl_slot *poVar4;
  uint uVar5;
  opl_channel *channel;
  long lVar6;
  ulong uVar7;
  
  __s = &this->opl3;
  lVar6 = 0;
  memset(__s,0,0x1070);
  pBVar1 = &(this->opl3).zeromod;
  do {
    *(opl_chip **)((long)(this->opl3).slot[0].prout + lVar6 + -0x18) = __s;
    *(Bit16s **)((long)(this->opl3).slot[0].prout + lVar6 + -8) = pBVar1;
    *(undefined4 *)((long)(this->opl3).slot[0].prout + lVar6 + 4) = 0x1ff01ff;
    *(undefined1 *)((long)(this->opl3).slot[0].prout + lVar6 + 9) = 0;
    *(Bit16s **)((long)(this->opl3).slot[0].prout + lVar6 + 0x10) = pBVar1;
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0xa20);
  uVar7 = 0;
  channel = __s->channel;
  do {
    bVar3 = ""[uVar7];
    poVar4 = (this->opl3).slot + bVar3;
    channel->slots[0] = poVar4;
    poVar2 = (this->opl3).slot + (ulong)bVar3 + 3;
    channel->slots[1] = poVar2;
    poVar4->channel = channel;
    poVar2->channel = channel;
    uVar5 = (int)(uVar7 / 9) * -9 + (int)uVar7;
    lVar6 = 3;
    if ((uVar5 < 3) || (lVar6 = -3, uVar5 < 6)) {
      channel->slots[2] = (opl_slot *)(__s->channel + lVar6 + uVar7);
    }
    channel->slots[3] = (opl_slot *)__s;
    channel->slots[4] = (opl_slot *)pBVar1;
    channel->slots[5] = (opl_slot *)pBVar1;
    channel->slots[6] = (opl_slot *)pBVar1;
    channel->slots[7] = (opl_slot *)pBVar1;
    *(Bit8u *)(channel->slots + 8) = '\0';
    *(undefined4 *)((long)channel->slots + 0x4a) = 0xffffffff;
    channel->slots[10] = (opl_slot *)0x3f8000003f800000;
    chan_setupalg(channel);
    uVar7 = uVar7 + 1;
    channel = (opl_channel *)(channel->slots + 0xb);
  } while (uVar7 != 0x12);
  (this->opl3).noise = 0x306600;
  (this->opl3).timer = 0;
  (this->opl3).FullPan = this->FullPan;
  return;
}

Assistant:

void NukedOPL3::Reset() {
	memset(&opl3, 0, sizeof(opl_chip));
	for (Bit8u slotnum = 0; slotnum < 36; slotnum++) {
		opl3.slot[slotnum].chip = &opl3;
		opl3.slot[slotnum].mod = &opl3.zeromod;
		opl3.slot[slotnum].eg_rout = 0x1ff;
		opl3.slot[slotnum].eg_out = 0x1ff;
		opl3.slot[slotnum].eg_gen = envelope_gen_num_off;
		opl3.slot[slotnum].trem = (Bit8u*)&opl3.zeromod;
	}
	for (Bit8u channum = 0; channum < 18; channum++) {
		opl3.channel[channum].slots[0] = &opl3.slot[ch_slot[channum]];
		opl3.channel[channum].slots[1] = &opl3.slot[ch_slot[channum] + 3];
		opl3.slot[ch_slot[channum]].channel = &opl3.channel[channum];
		opl3.slot[ch_slot[channum] + 3].channel = &opl3.channel[channum];
		if ((channum % 9) < 3) {
			opl3.channel[channum].pair = &opl3.channel[channum + 3];
		}
		else if ((channum % 9) < 6) {
			opl3.channel[channum].pair = &opl3.channel[channum - 3];
		}
		opl3.channel[channum].chip = &opl3;
		opl3.channel[channum].out[0] = &opl3.zeromod;
		opl3.channel[channum].out[1] = &opl3.zeromod;
		opl3.channel[channum].out[2] = &opl3.zeromod;
		opl3.channel[channum].out[3] = &opl3.zeromod;
		opl3.channel[channum].chtype = ch_2op;
		opl3.channel[channum].cha = ~0;
		opl3.channel[channum].chb = ~0;
		opl3.channel[channum].fcha = 1.0;
		opl3.channel[channum].fchb = 1.0;
		chan_setupalg(&opl3.channel[channum]);
	}
	opl3.noise = 0x306600;
	opl3.timer = 0;
	opl3.FullPan = FullPan;
}